

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

int event_remove_timer(event *ev)

{
  void *pvVar1;
  int iVar2;
  
  if (ev->ev_base == (event_base *)0x0) {
    event_warnx("%s: event has no event_base set.","event_remove_timer");
    iVar2 = -1;
  }
  else {
    pvVar1 = ev->ev_base->th_base_lock;
    if (pvVar1 != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,pvVar1);
    }
    event_remove_timer_nolock_(ev);
    pvVar1 = ev->ev_base->th_base_lock;
    if (pvVar1 == (void *)0x0) {
      iVar2 = 0;
    }
    else {
      iVar2 = 0;
      (*evthread_lock_fns_.unlock)(0,pvVar1);
    }
  }
  return iVar2;
}

Assistant:

int
event_remove_timer(struct event *ev)
{
	int res;

	if (EVUTIL_FAILURE_CHECK(!ev->ev_base)) {
		event_warnx("%s: event has no event_base set.", __func__);
		return -1;
	}

	EVBASE_ACQUIRE_LOCK(ev->ev_base, th_base_lock);

	res = event_remove_timer_nolock_(ev);

	EVBASE_RELEASE_LOCK(ev->ev_base, th_base_lock);

	return (res);
}